

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O1

TString * LoadString(LoadState *S)

{
  size_t l;
  TString *pTVar1;
  size_t size;
  lu_byte x;
  ulong local_40;
  byte local_38 [40];
  
  LoadBlock(S,local_38,1);
  local_40 = (ulong)local_38[0];
  if (local_40 == 0xff) {
    LoadBlock(S,&local_40,8);
  }
  if (local_40 == 0) {
    pTVar1 = (TString *)0x0;
  }
  else {
    l = local_40 - 1;
    if (local_40 < 0x2a) {
      local_40 = l;
      LoadBlock(S,local_38,l);
      pTVar1 = luaS_newlstr(S->L,(char *)local_38,local_40);
    }
    else {
      local_40 = l;
      pTVar1 = luaS_createlngstrobj(S->L,l);
      LoadBlock(S,pTVar1 + 1,local_40);
    }
  }
  return pTVar1;
}

Assistant:

static TString *LoadString(LoadState *S) {
    size_t size = LoadByte(S);
    if (size == 0xFF)
        LoadVar(S, size);
    if (size == 0)
        return NULL;
    else if (--size <= LUAI_MAXSHORTLEN) {  /* short string? */
        char buff[LUAI_MAXSHORTLEN];
        LoadVector(S, buff, size);
        return luaS_newlstr(S->L, buff, size);
    } else {  /* long string */
        TString *ts = luaS_createlngstrobj(S->L, size);
        LoadVector(S, getstr(ts), size);  /* load directly in final place */
        return ts;
    }
}